

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# esextcDrawBuffersIndexedDefaultState.cpp
# Opt level: O3

IterateResult __thiscall
glcts::DrawBuffersIndexedDefaultState::iterate(DrawBuffersIndexedDefaultState *this)

{
  bool bVar1;
  int iVar2;
  undefined4 extraout_var;
  char *description;
  GLint maxDrawBuffers;
  BlendMaskStateMachine state;
  int local_44;
  BlendMaskStateMachine local_40;
  
  iVar2 = (*((this->super_DrawBuffersIndexedBase).super_TestCaseBase.m_context)->m_renderCtx->
            _vptr_RenderContext[3])();
  local_44 = 0;
  (**(code **)(CONCAT44(extraout_var,iVar2) + 0x868))(0x8824,&local_44);
  if (local_44 < 4) {
    tcu::TestContext::setTestResult
              ((this->super_DrawBuffersIndexedBase).super_TestCaseBase.super_TestCase.super_TestNode
               .m_testCtx,QP_TEST_RESULT_FAIL,"Minimum number of draw buffers too low");
  }
  else {
    DrawBuffersIndexedBase::BlendMaskStateMachine::BlendMaskStateMachine
              (&local_40,(this->super_DrawBuffersIndexedBase).super_TestCaseBase.m_context,
               ((this->super_DrawBuffersIndexedBase).super_TestCaseBase.super_TestCase.
                super_TestNode.m_testCtx)->m_log,local_44);
    bVar1 = DrawBuffersIndexedBase::BlendMaskStateMachine::CheckAll(&local_40);
    if (bVar1) {
      iVar2 = (**(code **)(CONCAT44(extraout_var,iVar2) + 0x800))();
      description = "Pass";
      if (iVar2 != 0) {
        description = "Some functions generated error";
      }
      tcu::TestContext::setTestResult
                ((this->super_DrawBuffersIndexedBase).super_TestCaseBase.super_TestCase.
                 super_TestNode.m_testCtx,(uint)(iVar2 != 0),description);
    }
    else {
      tcu::TestContext::setTestResult
                ((this->super_DrawBuffersIndexedBase).super_TestCaseBase.super_TestCase.
                 super_TestNode.m_testCtx,QP_TEST_RESULT_FAIL,"Default state verification failed");
    }
    if (local_40.state.
        super__Vector_base<glcts::DrawBuffersIndexedBase::BlendMaskState,_std::allocator<glcts::DrawBuffersIndexedBase::BlendMaskState>_>
        ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_40.state.
                      super__Vector_base<glcts::DrawBuffersIndexedBase::BlendMaskState,_std::allocator<glcts::DrawBuffersIndexedBase::BlendMaskState>_>
                      ._M_impl.super__Vector_impl_data._M_start,
                      (long)local_40.state.
                            super__Vector_base<glcts::DrawBuffersIndexedBase::BlendMaskState,_std::allocator<glcts::DrawBuffersIndexedBase::BlendMaskState>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_40.state.
                            super__Vector_base<glcts::DrawBuffersIndexedBase::BlendMaskState,_std::allocator<glcts::DrawBuffersIndexedBase::BlendMaskState>_>
                            ._M_impl.super__Vector_impl_data._M_start);
    }
  }
  return STOP;
}

Assistant:

tcu::TestNode::IterateResult DrawBuffersIndexedDefaultState::iterate()
{
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	// Check number of available draw buffers
	glw::GLint maxDrawBuffers = 0;
	gl.getIntegerv(GL_MAX_DRAW_BUFFERS, &maxDrawBuffers);
	if (maxDrawBuffers < 4)
	{
		m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Minimum number of draw buffers too low");
		return STOP;
	}

	BlendMaskStateMachine state(m_context, m_testCtx.getLog(), maxDrawBuffers);
	if (!state.CheckAll())
	{
		m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Default state verification failed");
		return STOP;
	}

	// Check for error
	glw::GLenum error_code = gl.getError();
	if (error_code != GL_NO_ERROR)
	{
		m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Some functions generated error");
		return STOP;
	}

	m_testCtx.setTestResult(QP_TEST_RESULT_PASS, "Pass");
	return STOP;
}